

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::DynamicMapField
          (DynamicMapField *this,Message *default_entry)

{
  TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
  TypeDefinedMapFieldBase
            (&this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
            );
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase._vptr_MapFieldBase = (_func_int **)&PTR__DynamicMapField_00773bc8;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::Map(&this->map_);
  this->default_entry_ = default_entry;
  return;
}

Assistant:

DynamicMapField::DynamicMapField(const Message* default_entry)
    : default_entry_(default_entry) {
}